

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBString *b,CBString *s)

{
  ulong *puVar1;
  byte bVar2;
  uchar splitChar;
  CBStringException *this_00;
  int iVar3;
  int iVar4;
  int i;
  CBStringException bstr__cppwrapper_exception;
  anon_struct_64_1_bc116759 chrs;
  undefined **local_c0 [2];
  void *local_b0;
  string local_98;
  ulong local_78 [9];
  
  iVar3 = (s->super_tagbstring).slen;
  if (iVar3 == 1) {
    splitChar = CBString::character(s,0);
    split(this,b,splitChar);
    return;
  }
  if (iVar3 == 0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"CBString::Null splitstring failure","");
    CBStringException::CBStringException((CBStringException *)local_c0,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_c0);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      bVar2 = CBString::character(s,iVar3);
      puVar1 = (ulong *)((long)local_78 + (ulong)(bVar2 >> 2 & 0x38));
      *puVar1 = *puVar1 | 1L << (bVar2 & 0x1f);
      iVar3 = iVar3 + 1;
    } while (iVar3 < (s->super_tagbstring).slen);
  }
  iVar3 = (b->super_tagbstring).slen;
  iVar4 = 0;
  do {
    i = iVar4;
    if (iVar4 < iVar3) {
      do {
        bVar2 = CBString::character(b,i);
        if ((*(uint *)((long)local_78 + (ulong)(bVar2 >> 2 & 0x38)) >> (bVar2 & 0x1f) & 1) != 0)
        break;
        i = i + 1;
      } while (i < (b->super_tagbstring).slen);
      if (iVar4 <= i) goto LAB_0013e7e5;
    }
    else {
LAB_0013e7e5:
      CBString::CBString((CBString *)local_c0,(b->super_tagbstring).data + iVar4,i - iVar4);
      std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
      emplace_back<Bstrlib::CBString>
                ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,
                 (CBString *)local_c0);
      local_c0[0] = &PTR__CBString_00184860;
      if ((uchar *)local_b0 != (uchar *)0x0) {
        free(local_b0);
      }
    }
    iVar4 = i + 1;
    iVar3 = (b->super_tagbstring).slen;
    if (iVar3 <= i) {
      return;
    }
  } while( true );
}

Assistant:

void CBStringList::split (const CBString& b, const CBString& s) {
struct { unsigned long content[(1 << CHAR_BIT) / 32]; } chrs;
unsigned char c;
int p, i;

	if (s.length() == 0) bstringThrow ("Null splitstring failure");
	if (s.length() == 1) {
		this->split (b, s.character (0));
	} else {

		for (i=0; i < ((1 << CHAR_BIT) / 32); i++) chrs.content[i] = 0x0;
		for (i=0; i < s.length(); i++) {
			c = s.character (i);
			chrs.content[c >> 5] |= ((long)1) << (c & 31);
		}

		p = 0;
		do {
			for (i = p; i < b.length (); i++) {
				c = b.character (i);
				if (chrs.content[c >> 5] & ((long)1) << (c & 31)) break;
			}
			if (i >= p) this->push_back (CBString (&(b.data[p]), i - p));
			p = i + 1;
		} while (p <= b.length ());
	}
}